

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O3

void oonf_viewer_output_print_line(oonf_viewer_template *template)

{
  json_session *pjVar1;
  
  if (template->create_json != false) {
    pjVar1 = &template->_json;
    json_start_object(pjVar1,0);
    json_print_templates(pjVar1,template->data,template->data_size);
    json_end_object(pjVar1);
    return;
  }
  abuf_add_template(template->out,template->_storage,0);
  abuf_puts(template->out,"\n");
  return;
}

Assistant:

void
oonf_viewer_output_print_line(struct oonf_viewer_template *template) {
  if (!template->create_json) {
    abuf_add_template(template->out, template->_storage, false);
    abuf_puts(template->out, "\n");
  }
  else {
    /* JSON output */
    json_start_object(&template->_json, NULL);
    json_print_templates(&template->_json, template->data, template->data_size);
    json_end_object(&template->_json);
  }
}